

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int vorbis_decode_packet_rest
              (vorb *f,int *len,Mode *m,int left_start,int left_end,int right_start,int right_end,
              int *p_left)

{
  short sVar1;
  uint uVar2;
  code *pcVar3;
  short sVar4;
  int iVar5;
  uint32 uVar6;
  int in_ECX;
  byte *in_RDX;
  int *in_RSI;
  Codebook *in_RDI;
  int in_R9D;
  int in_stack_00000008;
  int *in_stack_00000010;
  SDL_AssertState sdl_assert_state_2;
  uint32 current_end;
  float m2;
  float a2;
  float *a;
  float *m_1;
  int n2_1;
  SDL_AssertState sdl_assert_state_1;
  int ch;
  uint8 do_not_decode [256];
  int r;
  float *residue_buffers [16];
  SDL_AssertState sdl_assert_state;
  int val;
  int room;
  int lowroom;
  int highroom;
  int pred;
  int high;
  int low;
  int n_2;
  Codebook *c_1;
  int temp;
  int book;
  int n_1;
  Codebook *c;
  int cval;
  int csub;
  int cbits;
  int cdim;
  int pclass;
  int offset;
  int range;
  uint8 step2_flag [256];
  short *finalY;
  Floor1 *g;
  int FAudio_floor;
  int s;
  int really_zero_channel [256];
  int zero_channel [256];
  int n2;
  int n;
  int k;
  int j;
  int i;
  Mapping *map;
  undefined4 in_stack_fffffffffffff440;
  int in_stack_fffffffffffff444;
  Codebook *in_stack_fffffffffffff448;
  Codebook *c_00;
  undefined4 in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff45c;
  float local_ba0;
  float local_b9c;
  FAudioIOStream *in_stack_fffffffffffff468;
  FAudioIOStream *in_stack_fffffffffffff470;
  int in_stack_fffffffffffff478;
  int in_stack_fffffffffffff47c;
  int in_stack_fffffffffffff480;
  int in_stack_fffffffffffff484;
  vorb *in_stack_fffffffffffff488;
  uint8 *in_stack_fffffffffffff4a0;
  float *local_a68 [17];
  int local_9dc;
  uint local_9d8;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  int local_9c8;
  uint local_9c4;
  uint local_9c0;
  uint local_9bc;
  Codebook *local_9b8;
  int local_9ac;
  int local_9a8;
  uint local_9a4;
  Codebook *local_9a0;
  uint local_994;
  uint local_990;
  uint local_98c;
  uint local_988;
  uint local_984;
  int local_980;
  int32 local_97c;
  char local_978 [264];
  FAudioIOStream *local_870;
  byte *local_868;
  uint local_860;
  uint local_85c;
  int local_858 [256];
  int local_458 [259];
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  Mapping *local_38;
  int local_2c;
  int local_24;
  byte *local_20;
  int *local_18;
  Codebook *local_10;
  
  local_48 = *(int *)((long)in_RDI->fast_huffman + (ulong)*in_RDX * 4 + 0x70);
  local_38 = *(Mapping **)((long)in_RDI->fast_huffman + 0x1b8) + in_RDX[1];
  local_4c = local_48 >> 1;
  local_2c = in_R9D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_3c = 0; (int)local_3c < local_10->entries; local_3c = local_3c + 1) {
    local_85c = (uint)local_38->chan[(int)local_3c].mux;
    local_458[(int)local_3c] = 0;
    local_860 = (uint)local_38->submap_floor[(int)local_85c];
    if (local_10->fast_huffman[(long)(int)local_860 + 0x4a] == 0) {
      iVar5 = error((vorb *)local_10,VORBIS_invalid_stream);
      return iVar5;
    }
    local_868 = (byte *)(*(long *)(local_10->fast_huffman + 0x8c) + (long)(int)local_860 * 0x63c);
    uVar6 = get_bits((vorb *)in_stack_fffffffffffff448,in_stack_fffffffffffff444);
    if (uVar6 == 0) {
LAB_0013f007:
      local_458[(int)local_3c] = 1;
    }
    else {
      local_97c = vorbis_decode_packet_rest::range_list[(int)(local_868[0x634] - 1)];
      local_980 = 2;
      local_870 = *(FAudioIOStream **)
                   ((long)local_10->fast_huffman + ((long)(int)local_3c + 0x9a) * 8);
      in_stack_fffffffffffff448 = local_10;
      ilog(local_97c);
      uVar6 = get_bits((vorb *)in_stack_fffffffffffff448,in_stack_fffffffffffff444);
      *(short *)&local_870->data = (short)uVar6;
      c_00 = local_10;
      ilog(local_97c);
      uVar6 = get_bits((vorb *)in_stack_fffffffffffff448,in_stack_fffffffffffff444);
      *(short *)((long)&local_870->data + 2) = (short)uVar6;
      for (local_40 = 0; local_40 < (int)(uint)*local_868; local_40 = local_40 + 1) {
        local_984 = (uint)local_868[(long)local_40 + 1];
        local_988 = (uint)local_868[(long)(int)local_984 + 0x21];
        local_98c = (uint)local_868[(long)(int)local_984 + 0x31];
        local_990 = (1 << (local_868[(long)(int)local_984 + 0x31] & 0x1f)) - 1;
        local_994 = 0;
        if (local_98c != 0) {
          local_9a0 = *(Codebook **)((long)local_10->fast_huffman + 0x88) +
                      (int)(uint)local_868[(long)(int)local_984 + 0x41];
          if (*(int *)((long)local_10->fast_huffman + 0x6c8) < 10) {
            prep_huffman((vorb *)CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440));
          }
          local_994 = (uint)local_9a0->fast_huffman
                            [(int)(*(uint32 *)((long)local_10->fast_huffman + 0x6c4) & 0x3ff)];
          if ((int)local_994 < 0) {
            local_994 = codebook_decode_scalar_raw
                                  ((vorb *)CONCAT44(in_stack_fffffffffffff45c,
                                                    in_stack_fffffffffffff458),c_00);
          }
          else {
            local_9a4 = (uint)local_9a0->codeword_lengths[(int)local_994];
            *(uint32 *)((long)local_10->fast_huffman + 0x6c4) =
                 *(uint32 *)((long)local_10->fast_huffman + 0x6c4) >>
                 (local_9a0->codeword_lengths[(int)local_994] & 0x1f);
            *(uint *)((long)local_10->fast_huffman + 0x6c8) =
                 *(int *)((long)local_10->fast_huffman + 0x6c8) - local_9a4;
            if (*(int *)((long)local_10->fast_huffman + 0x6c8) < 0) {
              *(int *)((long)local_10->fast_huffman + 0x6c8) = 0;
              local_994 = 0xffffffff;
            }
          }
          if (local_9a0->sparse != '\0') {
            local_994 = local_9a0->sorted_values[(int)local_994];
          }
        }
        for (local_44 = 0; local_44 < (int)local_988; local_44 = local_44 + 1) {
          local_9a8 = (int)*(short *)(local_868 +
                                     (long)(int)(local_994 & local_990) * 2 +
                                     (long)(int)local_984 * 0x10 + 0x52);
          local_994 = (int)local_994 >> ((byte)local_98c & 0x1f);
          if (local_9a8 < 0) {
            *(undefined2 *)((long)&local_870->data + (long)local_980 * 2) = 0;
          }
          else {
            local_9b8 = *(Codebook **)((long)local_10->fast_huffman + 0x88) + local_9a8;
            if (*(int *)((long)local_10->fast_huffman + 0x6c8) < 10) {
              prep_huffman((vorb *)CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440));
            }
            local_9ac = (int)local_9b8->fast_huffman
                             [(int)(*(uint32 *)((long)local_10->fast_huffman + 0x6c4) & 0x3ff)];
            if (local_9ac < 0) {
              local_9ac = codebook_decode_scalar_raw
                                    ((vorb *)CONCAT44(in_stack_fffffffffffff45c,
                                                      in_stack_fffffffffffff458),c_00);
            }
            else {
              local_9bc = (uint)local_9b8->codeword_lengths[local_9ac];
              *(uint32 *)((long)local_10->fast_huffman + 0x6c4) =
                   *(uint32 *)((long)local_10->fast_huffman + 0x6c4) >>
                   (local_9b8->codeword_lengths[local_9ac] & 0x1f);
              *(uint *)((long)local_10->fast_huffman + 0x6c8) =
                   *(int *)((long)local_10->fast_huffman + 0x6c8) - local_9bc;
              if (*(int *)((long)local_10->fast_huffman + 0x6c8) < 0) {
                *(int *)((long)local_10->fast_huffman + 0x6c8) = 0;
                local_9ac = -1;
              }
            }
            if (local_9b8->sparse != '\0') {
              local_9ac = local_9b8->sorted_values[local_9ac];
            }
            *(short *)((long)&local_870->data + (long)local_980 * 2) = (short)local_9ac;
          }
          local_980 = local_980 + 1;
        }
      }
      if (*(int *)((long)local_10->fast_huffman + 0x6c8) == -1) goto LAB_0013f007;
      local_978[1] = 1;
      local_978[0] = '\x01';
      for (local_40 = 2; local_40 < *(int *)(local_868 + 0x638); local_40 = local_40 + 1) {
        local_9c0 = (uint)local_868[(long)local_40 * 2 + 0x440];
        local_9c4 = (uint)local_868[(long)local_40 * 2 + 0x441];
        local_9d0 = predict_point((int)((ulong)c_00 >> 0x20),(int)c_00,
                                  (int)((ulong)in_stack_fffffffffffff448 >> 0x20),
                                  (int)in_stack_fffffffffffff448,in_stack_fffffffffffff444);
        sVar1 = *(short *)((long)&local_870->data + (long)local_40 * 2);
        local_9d8 = (uint)sVar1;
        local_9cc = local_97c - local_9d0;
        if (local_9cc < local_9d0) {
          local_9d4 = local_9cc * 2;
        }
        else {
          local_9d4 = local_9d0 << 1;
        }
        sVar4 = (short)local_9d0;
        if (local_9d8 == 0) {
          local_978[local_40] = '\0';
          *(short *)((long)&local_870->data + (long)local_40 * 2) = sVar4;
        }
        else {
          local_978[(int)local_9c4] = '\x01';
          local_978[(int)local_9c0] = '\x01';
          local_978[local_40] = '\x01';
          if ((int)local_9d8 < local_9d4) {
            if ((local_9d8 & 1) == 0) {
              *(short *)((long)&local_870->data + (long)local_40 * 2) =
                   sVar4 + (short)((int)local_9d8 >> 1);
            }
            else {
              *(short *)((long)&local_870->data + (long)local_40 * 2) =
                   sVar4 - (short)((int)(local_9d8 + 1) >> 1);
            }
          }
          else if (local_9d0 < local_9cc) {
            *(short *)((long)&local_870->data + (long)local_40 * 2) = sVar1;
          }
          else {
            *(short *)((long)&local_870->data + (long)local_40 * 2) =
                 (sVar4 - sVar1) + (short)local_9cc + -1;
          }
        }
        local_9c8 = local_9d0;
      }
      for (local_40 = 0; local_40 < *(int *)(local_868 + 0x638); local_40 = local_40 + 1) {
        if (local_978[local_40] == '\0') {
          *(undefined2 *)((long)&local_870->data + (long)local_40 * 2) = 0xffff;
        }
      }
    }
  }
  if (((stb_vorbis_alloc *)((long)local_10->fast_huffman + 0x50))->alloc_buffer != (char *)0x0) {
    do {
      if (*(int *)((long)local_10->fast_huffman + 0x58) ==
          *(int *)((long)local_10->fast_huffman + 100)) goto LAB_0013f0b6;
      local_9dc = SDL_ReportAssertion(&vorbis_decode_packet_rest::sdl_assert_data,
                                      "vorbis_decode_packet_rest",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                      ,0xcd6);
    } while (local_9dc == 0);
    if (local_9dc == 1) {
      pcVar3 = (code *)swi(3);
      iVar5 = (*pcVar3)();
      return iVar5;
    }
  }
LAB_0013f0b6:
  SDL_memcpy(local_858,local_458,(long)local_10->entries << 2);
  for (local_3c = 0; (int)local_3c < (int)(uint)local_38->coupling_steps; local_3c = local_3c + 1) {
    if ((local_458[local_38->chan[(int)local_3c].magnitude] == 0) ||
       (local_458[local_38->chan[(int)local_3c].angle] == 0)) {
      local_458[local_38->chan[(int)local_3c].angle] = 0;
      local_458[local_38->chan[(int)local_3c].magnitude] = 0;
    }
  }
  for (local_3c = 0; (int)local_3c < (int)(uint)local_38->submaps; local_3c = local_3c + 1) {
    in_stack_fffffffffffff484 = 0;
    for (local_40 = 0; local_40 < local_10->entries; local_40 = local_40 + 1) {
      if (local_38->chan[local_40].mux == local_3c) {
        if (local_458[local_40] == 0) {
          (&stack0xfffffffffffff488)[in_stack_fffffffffffff484] = 0;
          local_a68[in_stack_fffffffffffff484] =
               *(float **)(local_10->fast_huffman + (long)local_40 * 4 + 0x1a4);
        }
        else {
          (&stack0xfffffffffffff488)[in_stack_fffffffffffff484] = 1;
          local_a68[in_stack_fffffffffffff484] = (float *)0x0;
        }
        in_stack_fffffffffffff484 = in_stack_fffffffffffff484 + 1;
      }
    }
    decode_residue((vorb *)local_10,local_a68,in_stack_fffffffffffff484,local_4c,
                   (uint)local_38->submap_residue[(int)local_3c],&stack0xfffffffffffff488);
  }
  if (((stb_vorbis_alloc *)((long)local_10->fast_huffman + 0x50))->alloc_buffer != (char *)0x0) {
    do {
      if (*(int *)((long)local_10->fast_huffman + 0x58) ==
          *(int *)((long)local_10->fast_huffman + 100)) goto LAB_0013f38e;
      in_stack_fffffffffffff480 =
           SDL_ReportAssertion(&vorbis_decode_packet_rest::sdl_assert_data_1,
                               "vorbis_decode_packet_rest",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                               ,0xcf7);
    } while (in_stack_fffffffffffff480 == 0);
    if (in_stack_fffffffffffff480 == 1) {
      pcVar3 = (code *)swi(3);
      iVar5 = (*pcVar3)();
      return iVar5;
    }
  }
LAB_0013f38e:
  local_3c = (uint)local_38->coupling_steps;
  while (local_3c = local_3c - 1, -1 < (int)local_3c) {
    in_stack_fffffffffffff47c = local_48 >> 1;
    in_stack_fffffffffffff470 =
         *(FAudioIOStream **)
          ((long)local_10->fast_huffman +
          ((ulong)local_38->chan[(int)local_3c].magnitude + 0x69) * 8);
    in_stack_fffffffffffff468 =
         *(FAudioIOStream **)
          ((long)local_10->fast_huffman + ((ulong)local_38->chan[(int)local_3c].angle + 0x69) * 8);
    for (local_40 = 0; local_40 < in_stack_fffffffffffff47c; local_40 = local_40 + 1) {
      if (*(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4) <= 0.0) {
        if (*(float *)((long)&in_stack_fffffffffffff468->data + (long)local_40 * 4) <= 0.0) {
          local_b9c = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4);
          local_ba0 = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4) -
                      *(float *)((long)&in_stack_fffffffffffff468->data + (long)local_40 * 4);
        }
        else {
          local_ba0 = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4);
          local_b9c = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4) +
                      *(float *)((long)&in_stack_fffffffffffff468->data + (long)local_40 * 4);
        }
      }
      else if (*(float *)((long)&in_stack_fffffffffffff468->data + (long)local_40 * 4) <= 0.0) {
        local_b9c = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4);
        local_ba0 = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4) +
                    *(float *)((long)&in_stack_fffffffffffff468->data + (long)local_40 * 4);
      }
      else {
        local_ba0 = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4);
        local_b9c = *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4) -
                    *(float *)((long)&in_stack_fffffffffffff468->data + (long)local_40 * 4);
      }
      *(float *)((long)&in_stack_fffffffffffff470->data + (long)local_40 * 4) = local_ba0;
      *(float *)((long)&in_stack_fffffffffffff468->data + (long)local_40 * 4) = local_b9c;
    }
  }
  for (local_3c = 0; (int)local_3c < local_10->entries; local_3c = local_3c + 1) {
    if (local_458[(long)(int)local_3c + -0x100] == 0) {
      do_floor(in_stack_fffffffffffff488,
               (Mapping *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
               in_stack_fffffffffffff47c,in_stack_fffffffffffff478,
               (float *)in_stack_fffffffffffff470,(YTYPE *)in_stack_fffffffffffff468,
               in_stack_fffffffffffff4a0);
    }
    else {
      SDL_memset(*(FAudioIOStream **)
                  ((long)local_10->fast_huffman + ((long)(int)local_3c + 0x69) * 8),0,
                 (long)local_4c << 2);
    }
  }
  for (local_3c = 0; (int)local_3c < local_10->entries; local_3c = local_3c + 1) {
    inverse_mdct(*(float **)(local_10->fast_huffman + (long)(int)local_3c * 4 + 0x1a4),local_48,
                 (vorb *)local_10,(uint)*local_20);
  }
  flush_packet((vorb *)0x13f751);
  if (*(char *)((long)local_10->fast_huffman + 0x6b5) == '\0') {
    if (*(int *)(local_10->fast_huffman + 0x36c) != 0) {
      if (*(int *)(local_10->fast_huffman + 0x36c) < local_2c - local_24) {
        local_24 = *(int *)(local_10->fast_huffman + 0x36c) + local_24;
        *in_stack_00000010 = local_24;
        local_10->fast_huffman[0x36c] = 0;
        local_10->fast_huffman[0x36d] = 0;
      }
      else {
        *(int *)(local_10->fast_huffman + 0x36c) =
             *(int *)(local_10->fast_huffman + 0x36c) - (local_2c - local_24);
        local_24 = local_2c;
        *in_stack_00000010 = local_2c;
      }
    }
  }
  else {
    *(int *)(local_10->fast_huffman + 0x2a8) = -local_4c;
    *(int *)(local_10->fast_huffman + 0x36c) = local_48 - in_stack_00000008;
    local_10->fast_huffman[0x2aa] = 1;
    local_10->fast_huffman[0x2ab] = 0;
    *(undefined1 *)((long)local_10->fast_huffman + 0x6b5) = 0;
  }
  if (*(int *)(local_10->fast_huffman + 0x360) == *(int *)(local_10->fast_huffman + 0x368)) {
    if (((*(int *)(local_10->fast_huffman + 0x2aa) != 0) &&
        ((*(byte *)((long)local_10->fast_huffman + 0x6b3) & 4) != 0)) &&
       (uVar2 = *(uint *)(local_10->fast_huffman + 0x36a),
       uVar2 < (uint)(*(int *)(local_10->fast_huffman + 0x2a8) + (in_stack_00000008 - local_24)))) {
      if (uVar2 < *(uint *)(local_10->fast_huffman + 0x2a8)) {
        *local_18 = 0;
      }
      else {
        *local_18 = uVar2 - *(int *)(local_10->fast_huffman + 0x2a8);
      }
      *local_18 = local_24 + *local_18;
      if (in_stack_00000008 < *local_18) {
        *local_18 = in_stack_00000008;
      }
      *(int *)(local_10->fast_huffman + 0x2a8) =
           *local_18 + *(int *)(local_10->fast_huffman + 0x2a8);
      return 1;
    }
    *(int *)(local_10->fast_huffman + 0x2a8) =
         *(int *)(local_10->fast_huffman + 0x36a) - (local_4c - local_24);
    local_10->fast_huffman[0x2aa] = 1;
    local_10->fast_huffman[0x2ab] = 0;
  }
  if (*(int *)(local_10->fast_huffman + 0x2aa) != 0) {
    *(int *)(local_10->fast_huffman + 0x2a8) =
         (local_2c - local_24) + *(int *)(local_10->fast_huffman + 0x2a8);
  }
  if (*(long *)(local_10->fast_huffman + 0x28) != 0) {
    do {
      if (*(int *)(local_10->fast_huffman + 0x2c) == *(int *)(local_10->fast_huffman + 0x32))
      goto LAB_0013fabd;
      iVar5 = SDL_ReportAssertion(&vorbis_decode_packet_rest::sdl_assert_data_2,
                                  "vorbis_decode_packet_rest",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                  ,0xd6b);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar3 = (code *)swi(3);
      iVar5 = (*pcVar3)();
      return iVar5;
    }
  }
LAB_0013fabd:
  *local_18 = in_stack_00000008;
  return 1;
}

Assistant:

static int vorbis_decode_packet_rest(vorb *f, int *len, Mode *m, int left_start, int left_end, int right_start, int right_end, int *p_left)
{
   Mapping *map;
   int i,j,k,n,n2;
   int zero_channel[256];
   int really_zero_channel[256];

// WINDOWING

   n = f->blocksize[m->blockflag];
   map = &f->mapping[m->mapping];

// FLOORS
   n2 = n >> 1;

   CHECK(f);

   for (i=0; i < f->channels; ++i) {
      int s = map->chan[i].mux, floor;
      zero_channel[i] = FALSE;
      floor = map->submap_floor[s];
      if (f->floor_types[floor] == 0) {
         return error(f, VORBIS_invalid_stream);
      } else {
         Floor1 *g = &f->floor_config[floor].floor1;
         if (get_bits(f, 1)) {
            short *finalY;
            uint8 step2_flag[256];
            static int range_list[4] = { 256, 128, 86, 64 };
            int range = range_list[g->floor1_multiplier-1];
            int offset = 2;
            finalY = f->finalY[i];
            finalY[0] = get_bits(f, ilog(range)-1);
            finalY[1] = get_bits(f, ilog(range)-1);
            for (j=0; j < g->partitions; ++j) {
               int pclass = g->partition_class_list[j];
               int cdim = g->class_dimensions[pclass];
               int cbits = g->class_subclasses[pclass];
               int csub = (1 << cbits)-1;
               int cval = 0;
               if (cbits) {
                  Codebook *c = f->codebooks + g->class_masterbooks[pclass];
                  DECODE(cval,f,c);
               }
               for (k=0; k < cdim; ++k) {
                  int book = g->subclass_books[pclass][cval & csub];
                  cval = cval >> cbits;
                  if (book >= 0) {
                     int temp;
                     Codebook *c = f->codebooks + book;
                     DECODE(temp,f,c);
                     finalY[offset++] = temp;
                  } else
                     finalY[offset++] = 0;
               }
            }
            if (f->valid_bits == INVALID_BITS) goto error; // behavior according to spec
            step2_flag[0] = step2_flag[1] = 1;
            for (j=2; j < g->values; ++j) {
               int low, high, pred, highroom, lowroom, room, val;
               low = g->neighbors[j][0];
               high = g->neighbors[j][1];
               //neighbors(g->Xlist, j, &low, &high);
               pred = predict_point(g->Xlist[j], g->Xlist[low], g->Xlist[high], finalY[low], finalY[high]);
               val = finalY[j];
               highroom = range - pred;
               lowroom = pred;
               if (highroom < lowroom)
                  room = highroom * 2;
               else
                  room = lowroom * 2;
               if (val) {
                  step2_flag[low] = step2_flag[high] = 1;
                  step2_flag[j] = 1;
                  if (val >= room)
                     if (highroom > lowroom)
                        finalY[j] = val - lowroom + pred;
                     else
                        finalY[j] = pred - val + highroom - 1;
                  else
                     if (val & 1)
                        finalY[j] = pred - ((val+1)>>1);
                     else
                        finalY[j] = pred + (val>>1);
               } else {
                  step2_flag[j] = 0;
                  finalY[j] = pred;
               }
            }

#ifdef STB_VORBIS_NO_DEFER_FLOOR
            do_floor(f, map, i, n, f->floor_buffers[i], finalY, step2_flag);
#else
            // defer final floor computation until _after_ residue
            for (j=0; j < g->values; ++j) {
               if (!step2_flag[j])
                  finalY[j] = -1;
            }
#endif
         } else {
           error:
            zero_channel[i] = TRUE;
         }
         // So we just defer everything else to later

         // at this point we've decoded the floor into buffer
      }
   }
   CHECK(f);
   // at this point we've decoded all floors

   if (f->alloc.alloc_buffer)
      assert(f->alloc.alloc_buffer_length_in_bytes == f->temp_offset);

   // re-enable coupled channels if necessary
   memcpy(really_zero_channel, zero_channel, sizeof(really_zero_channel[0]) * f->channels);
   for (i=0; i < map->coupling_steps; ++i)
      if (!zero_channel[map->chan[i].magnitude] || !zero_channel[map->chan[i].angle]) {
         zero_channel[map->chan[i].magnitude] = zero_channel[map->chan[i].angle] = FALSE;
      }

   CHECK(f);
// RESIDUE DECODE
   for (i=0; i < map->submaps; ++i) {
      float *residue_buffers[STB_VORBIS_MAX_CHANNELS];
      int r;
      uint8 do_not_decode[256];
      int ch = 0;
      for (j=0; j < f->channels; ++j) {
         if (map->chan[j].mux == i) {
            if (zero_channel[j]) {
               do_not_decode[ch] = TRUE;
               residue_buffers[ch] = NULL;
            } else {
               do_not_decode[ch] = FALSE;
               residue_buffers[ch] = f->channel_buffers[j];
            }
            ++ch;
         }
      }
      r = map->submap_residue[i];
      decode_residue(f, residue_buffers, ch, n2, r, do_not_decode);
   }

   if (f->alloc.alloc_buffer)
      assert(f->alloc.alloc_buffer_length_in_bytes == f->temp_offset);
   CHECK(f);

// INVERSE COUPLING
   for (i = map->coupling_steps-1; i >= 0; --i) {
      int n2 = n >> 1;
      float *m = f->channel_buffers[map->chan[i].magnitude];
      float *a = f->channel_buffers[map->chan[i].angle    ];
      for (j=0; j < n2; ++j) {
         float a2,m2;
         if (m[j] > 0)
            if (a[j] > 0)
               m2 = m[j], a2 = m[j] - a[j];
            else
               a2 = m[j], m2 = m[j] + a[j];
         else
            if (a[j] > 0)
               m2 = m[j], a2 = m[j] + a[j];
            else
               a2 = m[j], m2 = m[j] - a[j];
         m[j] = m2;
         a[j] = a2;
      }
   }
   CHECK(f);

   // finish decoding the floors
#ifndef STB_VORBIS_NO_DEFER_FLOOR
   for (i=0; i < f->channels; ++i) {
      if (really_zero_channel[i]) {
         memset(f->channel_buffers[i], 0, sizeof(*f->channel_buffers[i]) * n2);
      } else {
         do_floor(f, map, i, n, f->channel_buffers[i], f->finalY[i], NULL);
      }
   }
#else
   for (i=0; i < f->channels; ++i) {
      if (really_zero_channel[i]) {
         memset(f->channel_buffers[i], 0, sizeof(*f->channel_buffers[i]) * n2);
      } else {
         for (j=0; j < n2; ++j)
            f->channel_buffers[i][j] *= f->floor_buffers[i][j];
      }
   }
#endif

// INVERSE MDCT
   CHECK(f);
   for (i=0; i < f->channels; ++i)
      inverse_mdct(f->channel_buffers[i], n, f, m->blockflag);
   CHECK(f);

   // this shouldn't be necessary, unless we exited on an error
   // and want to flush to get to the next packet
   flush_packet(f);

   if (f->first_decode) {
      // assume we start so first non-discarded sample is sample 0
      // this isn't to spec, but spec would require us to read ahead
      // and decode the size of all current frames--could be done,
      // but presumably it's not a commonly used feature
      f->current_loc = -n2; // start of first frame is positioned for discard
      // we might have to discard samples "from" the next frame too,
      // if we're lapping a large block then a small at the start?
      f->discard_samples_deferred = n - right_end;
      f->current_loc_valid = TRUE;
      f->first_decode = FALSE;
   } else if (f->discard_samples_deferred) {
      if (f->discard_samples_deferred >= right_start - left_start) {
         f->discard_samples_deferred -= (right_start - left_start);
         left_start = right_start;
         *p_left = left_start;
      } else {
         left_start += f->discard_samples_deferred;
         *p_left = left_start;
         f->discard_samples_deferred = 0;
      }
   } else if (f->previous_length == 0 && f->current_loc_valid) {
      // we're recovering from a seek... that means we're going to discard
      // the samples from this packet even though we know our position from
      // the last page header, so we need to update the position based on
      // the discarded samples here
      // but wait, the code below is going to add this in itself even
      // on a discard, so we don't need to do it here...
   }

   // check if we have ogg information about the sample # for this packet
   if (f->last_seg_which == f->end_seg_with_known_loc) {
      // if we have a valid current loc, and this is final:
      if (f->current_loc_valid && (f->page_flag & PAGEFLAG_last_page)) {
         uint32 current_end = f->known_loc_for_packet;
         // then let's infer the size of the (probably) short final frame
         if (current_end < f->current_loc + (right_end-left_start)) {
            if (current_end < f->current_loc) {
               // negative truncation, that's impossible!
               *len = 0;
            } else {
               *len = current_end - f->current_loc;
            }
            *len += left_start; // this doesn't seem right, but has no ill effect on my test files
            if (*len > right_end) *len = right_end; // this should never happen
            f->current_loc += *len;
            return TRUE;
         }
      }
      // otherwise, just set our sample loc
      // guess that the ogg granule pos refers to the _middle_ of the
      // last frame?
      // set f->current_loc to the position of left_start
      f->current_loc = f->known_loc_for_packet - (n2-left_start);
      f->current_loc_valid = TRUE;
   }
   if (f->current_loc_valid)
      f->current_loc += (right_start - left_start);

   if (f->alloc.alloc_buffer)
      assert(f->alloc.alloc_buffer_length_in_bytes == f->temp_offset);
   *len = right_end;  // ignore samples after the window goes to 0
   CHECK(f);

   return TRUE;
}